

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

int __thiscall molly::Device::close(Device *this,int __fd)

{
  MollyError *pMVar1;
  int iVar2;
  undefined4 in_register_00000034;
  string local_60;
  string local_40;
  
  if (this->_fd == -1) {
    pMVar1 = (MollyError *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,__fd));
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Device not open","");
    MollyError::MollyError(pMVar1,&local_40);
    __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
  }
  iVar2 = ::close(this->_fd);
  if (iVar2 == 0) {
    return 0;
  }
  pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Error closing device","");
  MollyError::MollyError(pMVar1,&local_60);
  __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
}

Assistant:

void Device::close()
{
  if (_fd == INVALID_FD)
    throw MollyError("Device not open");

  int res = ::close(_fd);

  if (res != 0)
    throw MollyError("Error closing device");
}